

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<Header>::relocate(QArrayDataPointer<Header> *this,qsizetype offset,Header **data)

{
  Header *d_first;
  Header *pHVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<Header,long_long>(this->ptr,this->size,d_first);
  if (data != (Header **)0x0) {
    pHVar1 = *data;
    if ((this->ptr <= pHVar1) && (pHVar1 < this->ptr + this->size)) {
      *data = pHVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }